

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxminddb_test_helper.c
# Opt level: O2

char * dup_entry_string_or_bail(MMDB_entry_data_s entry_data)

{
  size_t len;
  ulong uVar1;
  char *__dest;
  ulong __n;
  void *in_stack_00000018;
  
  for (uVar1 = 0;
      (__n = (ulong)entry_data.field_1.pointer, entry_data.field_1.pointer != uVar1 &&
      (__n = uVar1, *(char *)((long)in_stack_00000018 + uVar1) != '\0')); uVar1 = uVar1 + 1) {
  }
  __dest = (char *)malloc(__n + 1);
  if (__dest == (char *)0x0) {
    bail_out(0,"mmdb_strndup failed",0);
  }
  else {
    memcpy(__dest,in_stack_00000018,__n);
    __dest[__n] = '\0';
  }
  return __dest;
}

Assistant:

char *dup_entry_string_or_bail(MMDB_entry_data_s entry_data) {
    char *string = mmdb_strndup(entry_data.utf8_string, entry_data.data_size);
    if (NULL == string) {
        BAIL_OUT("mmdb_strndup failed");
    }

    return string;
}